

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::MethodDescriptorProto::SerializeWithCachedSizesToArray
          (MethodDescriptorProto *this,uint8 *target)

{
  bool bVar1;
  int iVar2;
  uint32 uVar3;
  char *pcVar4;
  string *psVar5;
  MethodOptions *this_00;
  uint8 *puVar6;
  UnknownFieldSet *pUVar7;
  byte *local_118;
  uint8 *target_local;
  MethodDescriptorProto *this_local;
  byte *local_58;
  byte *local_40;
  uint8 *local_28;
  byte *local_10;
  
  bVar1 = has_name(this);
  local_118 = target;
  if (bVar1) {
    name_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar4,iVar2,SERIALIZE);
    psVar5 = name_abi_cxx11_(this);
    uVar3 = internal::WireFormatLite::MakeTag(1,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *target = (byte)uVar3;
      local_28 = target + 1;
    }
    else if (uVar3 < 0x4000) {
      *target = (byte)uVar3 | 0x80;
      target[1] = (uint8)(uVar3 >> 7);
      local_28 = target + 2;
    }
    else {
      local_28 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,target);
    }
    uVar3 = std::__cxx11::string::size();
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_28);
    local_118 = io::CodedOutputStream::WriteStringToArray(psVar5,puVar6);
  }
  bVar1 = has_input_type(this);
  if (bVar1) {
    input_type_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    input_type_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar4,iVar2,SERIALIZE);
    psVar5 = input_type_abi_cxx11_(this);
    uVar3 = internal::WireFormatLite::MakeTag(2,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *local_118 = (byte)uVar3;
      local_40 = local_118 + 1;
    }
    else if (uVar3 < 0x4000) {
      *local_118 = (byte)uVar3 | 0x80;
      local_118[1] = (byte)(uVar3 >> 7);
      local_40 = local_118 + 2;
    }
    else {
      local_40 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,local_118);
    }
    uVar3 = std::__cxx11::string::size();
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_40);
    local_118 = io::CodedOutputStream::WriteStringToArray(psVar5,puVar6);
  }
  bVar1 = has_output_type(this);
  if (bVar1) {
    output_type_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    output_type_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar4,iVar2,SERIALIZE);
    psVar5 = output_type_abi_cxx11_(this);
    uVar3 = internal::WireFormatLite::MakeTag(3,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *local_118 = (byte)uVar3;
      local_58 = local_118 + 1;
    }
    else if (uVar3 < 0x4000) {
      *local_118 = (byte)uVar3 | 0x80;
      local_118[1] = (byte)(uVar3 >> 7);
      local_58 = local_118 + 2;
    }
    else {
      local_58 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,local_118);
    }
    uVar3 = std::__cxx11::string::size();
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_58);
    local_118 = io::CodedOutputStream::WriteStringToArray(psVar5,puVar6);
  }
  bVar1 = has_options(this);
  if (bVar1) {
    this_00 = options(this);
    uVar3 = internal::WireFormatLite::MakeTag(4,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *local_118 = (byte)uVar3;
      local_10 = local_118 + 1;
    }
    else if (uVar3 < 0x4000) {
      *local_118 = (byte)uVar3 | 0x80;
      local_118[1] = (byte)(uVar3 >> 7);
      local_10 = local_118 + 2;
    }
    else {
      local_10 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,local_118);
    }
    uVar3 = MethodOptions::GetCachedSize(this_00);
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_10);
    local_118 = MethodOptions::SerializeWithCachedSizesToArray(this_00,puVar6);
  }
  pUVar7 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar7);
  if (!bVar1) {
    pUVar7 = unknown_fields(this);
    local_118 = internal::WireFormat::SerializeUnknownFieldsToArray(pUVar7,local_118);
  }
  return local_118;
}

Assistant:

::google::protobuf::uint8* MethodDescriptorProto::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional string name = 1;
  if (has_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // optional string input_type = 2;
  if (has_input_type()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->input_type().data(), this->input_type().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->input_type(), target);
  }

  // optional string output_type = 3;
  if (has_output_type()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->output_type().data(), this->output_type().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        3, this->output_type(), target);
  }

  // optional .google.protobuf.MethodOptions options = 4;
  if (has_options()) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        4, this->options(), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}